

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.c
# Opt level: O0

void ZopfliCacheToSublen(ZopfliLongestMatchCache *lmc,size_t pos,size_t length,
                        unsigned_short *sublen)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  uchar *puVar4;
  uint uVar5;
  uint uVar6;
  long in_RCX;
  ulong in_RDX;
  size_t in_RSI;
  ZopfliLongestMatchCache *in_RDI;
  uint dist;
  uint length_1;
  uchar *cache;
  uint prevlength;
  uint maxlength;
  size_t j;
  size_t i;
  uint local_38;
  ulong local_30;
  ulong local_28;
  
  uVar5 = ZopfliMaxCachedSublen(in_RDI,in_RSI,in_RDX);
  local_38 = 0;
  if (2 < in_RDX) {
    puVar4 = in_RDI->sublen;
    for (local_30 = 0; local_30 < 8; local_30 = local_30 + 1) {
      bVar1 = puVar4[local_30 * 3 + in_RSI * 0x18];
      uVar6 = bVar1 + 3;
      bVar2 = puVar4[local_30 * 3 + in_RSI * 0x18 + 1];
      bVar3 = puVar4[local_30 * 3 + in_RSI * 0x18 + 2];
      for (local_28 = (ulong)local_38; local_28 <= uVar6; local_28 = local_28 + 1) {
        *(ushort *)(in_RCX + local_28 * 2) = (ushort)bVar2 + (ushort)bVar3 * 0x100;
      }
      if (uVar6 == uVar5) {
        return;
      }
      local_38 = bVar1 + 4;
    }
  }
  return;
}

Assistant:

void ZopfliCacheToSublen(const ZopfliLongestMatchCache* lmc,
                         size_t pos, size_t length,
                         unsigned short* sublen) {
  size_t i, j;
  unsigned maxlength = ZopfliMaxCachedSublen(lmc, pos, length);
  unsigned prevlength = 0;
  unsigned char* cache;
#if ZOPFLI_CACHE_LENGTH == 0
  return;
#endif
  if (length < 3) return;
  cache = &lmc->sublen[ZOPFLI_CACHE_LENGTH * pos * 3];
  for (j = 0; j < ZOPFLI_CACHE_LENGTH; j++) {
    unsigned length = cache[j * 3] + 3;
    unsigned dist = cache[j * 3 + 1] + 256 * cache[j * 3 + 2];
    for (i = prevlength; i <= length; i++) {
      sublen[i] = dist;
    }
    if (length == maxlength) break;
    prevlength = length + 1;
  }
}